

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::i32_Store8(w3Interp *this)

{
  uint32_t uVar1;
  undefined1 *puVar2;
  
  uVar1 = w3Stack::pop_u32(&this->super_w3Stack);
  puVar2 = (undefined1 *)LoadStore(this,1);
  *puVar2 = (char)uVar1;
  return;
}

Assistant:

INTERP (i32_Store8)
{
    const uint32_t a = pop_u32 ();
    *(uint8_t*)LoadStore (1) = (uint8_t)(a & 0xFF);
}